

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checkbox.cpp
# Opt level: O2

void __thiscall cursespp::Checkbox::Checkbox(Checkbox *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&UNCHECKED_abi_cxx11_,value);
  TextLabel::TextLabel(&this->super_TextLabel,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  (this->super_TextLabel).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__Checkbox_001bdf88;
  (this->super_TextLabel).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__Checkbox_001be1a8;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Checkbox_001be1d8;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Checkbox_001be200;
  (this->super_TextLabel).super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__Checkbox_001be228;
  sigslot::signal2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>::signal2
            (&this->CheckChanged);
  std::__cxx11::string::string((string *)&this->originalText,(string *)value);
  return;
}

Assistant:

Checkbox::Checkbox(const std::string& value)
: TextLabel(decorate(value, false))
, originalText(value) {
}